

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles2::Functional::anon_unknown_0::requireShaderCompiler
               (TestContext *testCtx,CallLogWrapper *gl)

{
  NotSupportedError *this;
  bool bVar1;
  allocator<char> local_3c;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  string local_38;
  
  state.m_preguard = 0xde;
  state.m_value = 0xde;
  state.m_postguard = 0xde;
  glu::CallLogWrapper::glGetBooleanv(gl,0x8dfa,&state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&state,testCtx);
  if ((bVar1) && (state.m_value == '\x01')) {
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Test requires SHADER_COMPILER = TRUE",&local_3c);
  tcu::NotSupportedError::NotSupportedError(this,&local_38);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void requireShaderCompiler (tcu::TestContext& testCtx, glu::CallLogWrapper& gl)
{
	StateQueryMemoryWriteGuard<GLboolean> state;
	gl.glGetBooleanv(GL_SHADER_COMPILER, &state);

	if (!state.verifyValidity(testCtx) || state != GL_TRUE)
		throw tcu::NotSupportedError("Test requires SHADER_COMPILER = TRUE");
}